

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_masabl_node(REF_NODE ref_node)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  iVar1 = ref_node->max;
  if (0 < iVar1) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (-1 < ref_node->global[lVar3]) {
        dVar5 = cos((*(double *)((long)ref_node->real + lVar4) + -0.5) * 3.14159265358979);
        dVar5 = dVar5 * 0.2 + 0.01;
        dVar6 = exp(*(double *)((long)ref_node->real + lVar4 + 0x10) * 6.0);
        uVar2 = ref_node_metric_form
                          (ref_node,(REF_INT)lVar3,1.0 / (dVar5 * dVar5),0.0,0.0,99.99999999999999,
                           0.0,1.0 / (dVar6 * 0.001 * dVar6 * 0.001));
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x160,"ref_metric_masabl_node",(ulong)uVar2,"set node met");
          return uVar2;
        }
        iVar1 = ref_node->max;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x78;
    } while (lVar3 < iVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_masabl_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL hx, hz, c, k1;

  each_ref_node_valid_node(ref_node, node) {
    hx =
        0.01 + 0.2 * cos(ref_math_pi * (ref_node_xyz(ref_node, 0, node) - 0.5));
    c = 0.001;
    k1 = 6.0;
    hz = c * exp(k1 * ref_node_xyz(ref_node, 2, node));
    RSS(ref_node_metric_form(ref_node, node, 1.0 / (hx * hx), 0, 0,
                             1.0 / (0.1 * 0.1), 0, 1.0 / (hz * hz)),
        "set node met");
  }

  return REF_SUCCESS;
}